

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O3

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  pointer *pp_Var1;
  pointer pcVar2;
  pointer p_Var3;
  iterator __position;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  __first;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  __last;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  _tess_edge_points *edge_points;
  pointer p_Var7;
  pointer p_Var8;
  float fVar9;
  float fVar10;
  _tess_edge new_edge;
  _tess_coordinate_cartesian local_60;
  value_type local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (run->n_vertices != 0) {
    uVar6 = 0;
    do {
      pcVar2 = (run->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (ulong)(uint)((int)uVar6 * 3);
      local_60.y = *(float *)(pcVar2 + uVar5 * 4 + 4);
      local_60.x = *(float *)(pcVar2 + uVar5 * 4);
      p_Var3 = (__return_storage_ptr__->
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      p_Var8 = (__return_storage_ptr__->
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
               )._M_impl.super__Vector_impl_data._M_start;
      p_Var7 = p_Var8;
      for (; p_Var8 != p_Var3; p_Var8 = p_Var8 + 1) {
        fVar9 = ((p_Var8->points).
                 super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ._M_impl.super__Vector_impl_data._M_start)->y - local_60.y;
        fVar10 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar10 = fVar9;
        }
        if (fVar10 < 0.001) {
          __position._M_current =
               (p_Var8->points).
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          p_Var7 = p_Var8;
          if (__position._M_current ==
              (p_Var8->points).
              super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
            ::
            _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                      ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                        *)p_Var8,__position,&local_60);
          }
          else {
            *__position._M_current = local_60;
            pp_Var1 = &(p_Var8->points).
                       super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pp_Var1 = *pp_Var1 + 1;
          }
          break;
        }
        p_Var7 = p_Var3;
      }
      if (p_Var7 == (__return_storage_ptr__->
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_58.points.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.points.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.points.
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.edge_length = 1.0;
        local_58.outermost_tess_level = run->outer[1];
        local_58.tess_level = local_58.outermost_tess_level;
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_58,(iterator)0x0,&local_60);
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
        ::push_back(__return_storage_ptr__,&local_58);
        if (local_58.points.
            super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.points.
                          super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.points.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.points.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < run->n_vertices);
    p_Var8 = (__return_storage_ptr__->
             super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (p_Var8 != (__return_storage_ptr__->
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        __first._M_current =
             (p_Var8->points).
             super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (p_Var8->points).
             super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          uVar6 = (long)__last._M_current - (long)__first._M_current >> 3;
          lVar4 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>>
                    (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>
                      )0xcc759c);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>>
                    (__first,__last,
                     (_Iter_comp_iter<bool_(*)(glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian)>
                      )0xcc759c);
        }
        p_Var8 = p_Var8 + 1;
      } while (p_Var8 != (__return_storage_ptr__->
                         super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForIsolinesTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First convert the array data to a vector of edges, where each edge
	 * is a vector of points with the same V component. After this is done,
	 * points for each edge need to be sorted by U component.
	 */
	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		/* Isolines are simple - we only need to create a new edge per each unique height */
		const float*			   coordinate = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;
		_tess_coordinate_cartesian new_item;

		new_item.x = coordinate[0];
		new_item.y = coordinate[1];

		/* Is V recognized? */
		_tess_edges_iterator edges_iterator;

		for (edges_iterator = result.begin(); edges_iterator != result.end(); edges_iterator++)
		{
			_tess_edge& edge = *edges_iterator;

			/* Each edge uses the same Y component, so we only need to check the first entry */
			if (de::abs(edge.points[0].y - coordinate[1]) < epsilon)
			{
				/* Add the new point to the vector */
				edge.points.push_back(new_item);

				break;
			}
		} /* for (all edges) */

		if (edges_iterator == result.end())
		{
			/* New edge starts at this point.
			 *
			 * Note that outermost tessellation level does not apply to this
			 * primitive mode.
			 **/
			_tess_edge new_edge(run.outer[1], run.outer[1], 1.0f);

			new_edge.points.push_back(new_item);

			result.push_back(new_edge);
		}
	} /* for (all vertices) */

	/* For each edge, sort the points by U coordinate */
	for (_tess_edges_iterator edges_iterator = result.begin(); edges_iterator != result.end(); ++edges_iterator)
	{
		_tess_edge_points& edge_points = edges_iterator->points;

		std::sort(edge_points.begin(), edge_points.end(), compareEdgeByX);
	}

	/* Done */
	return result;
}